

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

void __thiscall
PythonModuleClient::recv_event(PythonModuleClient *this,string *origin,string *event,TrodesMsg *msg)

{
  pointer pcVar1;
  undefined4 uVar2;
  int iVar3;
  override recv_event;
  undefined1 local_80 [8];
  long *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  uVar2 = PyGILState_Ensure();
  boost::python::converter::registration::get_class_object
            (boost::python::converter::detail::registered_base<AbstractModuleClient_const_volatile&>
             ::converters);
  boost::python::detail::wrapper_base::get_override
            (local_80,(_typeobject *)&this->super_wrapper<AbstractModuleClient>);
  iVar3 = PyObject_IsTrue(local_80);
  if (iVar3 < 0) {
    boost::python::throw_error_already_set();
  }
  if (iVar3 == 0) {
    *(long *)local_80 = *(long *)local_80 + -1;
    if (*(long *)local_80 == 0) {
      _Py_Dealloc();
    }
    pcVar1 = (origin->_M_dataplus)._M_p;
    local_70._M_allocated_capacity = (size_type)local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + origin->_M_string_length);
    pcVar1 = (event->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + event->_M_string_length);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((long *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity,local_60[0] + 1);
    }
  }
  else {
    boost::python::override::operator()
              ((override *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,origin,
               (TrodesMsg *)event);
    if ((local_78 != (long *)0x0) && (*local_78 = *local_78 + -1, *local_78 == 0)) {
      _Py_Dealloc();
    }
    *(long *)local_80 = *(long *)local_80 + -1;
    if (*(long *)local_80 == 0) {
      _Py_Dealloc();
    }
  }
  PyGILState_Release(uVar2);
  return;
}

Assistant:

void recv_event(std::string origin, std::string event, TrodesMsg &msg){
        PyLockGIL lock;
        if(override recv_event = this->get_override("recv_event")){
            try{
                recv_event(origin, event, msg);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_event in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_event(origin, event, msg);
    }